

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_epsv_disable(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  int *piVar2;
  CURLcode CVar3;
  
  if ((*(uint *)&(conn->bits).field_0x4 & 0x100a) == 0x1000) {
    Curl_failf(data,"Failed EPSV attempt, exiting");
    CVar3 = CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    Curl_infof(data,"Failed EPSV attempt. Disabling EPSV");
    puVar1 = &(conn->bits).field_0x6;
    *puVar1 = *puVar1 & 0xfb;
    puVar1 = &(data->state).field_0x6d0;
    *puVar1 = *puVar1 & 0xf7;
    CVar3 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","PASV");
    if (CVar3 == CURLE_OK) {
      piVar2 = &(conn->proto).ftpc.count1;
      *piVar2 = *piVar2 + 1;
      (data->conn->proto).ftpc.state = FTP_PASV;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_epsv_disable(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.ipv6
#ifndef CURL_DISABLE_PROXY
     && !(conn->bits.tunnel_proxy || conn->bits.socksproxy)
#endif
    ) {
    /* We can't disable EPSV when doing IPv6, so this is instead a fail */
    failf(data, "Failed EPSV attempt, exiting");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  infof(data, "Failed EPSV attempt. Disabling EPSV");
  /* disable it for next transfer */
  conn->bits.ftp_use_epsv = FALSE;
  data->state.errorbuf = FALSE; /* allow error message to get
                                         rewritten */
  result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "%s", "PASV");
  if(!result) {
    conn->proto.ftpc.count1++;
    /* remain in/go to the FTP_PASV state */
    state(data, FTP_PASV);
  }
  return result;
}